

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  undefined2 uVar1;
  char *__dest;
  ulong uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ushort uVar6;
  int iVar7;
  u32 uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long in_FS_OFFSET;
  double dVar12;
  undefined8 uStack_60;
  StrAccum local_58;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pMem->szMalloc < 0x20) {
    uStack_60 = (code *)0x1412d8;
    iVar7 = sqlite3VdbeMemGrow(pMem,0x20,0);
    if (iVar7 != 0) {
      pMem->enc = '\0';
      iVar7 = 7;
      goto LAB_00141440;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = pMem->flags & 0x2d;
  }
  __dest = pMem->z;
  if ((pMem->flags & 4) == 0) {
    local_58.db = (sqlite3 *)0x0;
    local_58.nAlloc = 0x20;
    local_58.mxAlloc = 0;
    local_58.nChar = 0;
    local_58.accError = '\0';
    local_58.printfFlags = '\0';
    if ((pMem->flags & 0x20) == 0) {
      dVar12 = (pMem->u).r;
    }
    else {
      dVar12 = (double)(pMem->u).i;
    }
    uStack_60 = (code *)0x141403;
    local_58.zText = __dest;
    sqlite3_str_appendf(&local_58,"%!.15g",dVar12);
    __dest[local_58.nChar] = '\0';
    uVar8 = local_58.nChar;
  }
  else {
    uVar2 = (pMem->u).i;
    uVar9 = -uVar2;
    if (0 < (long)uVar2) {
      uVar9 = uVar2;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar9;
    local_58._20_8_ =
         CONCAT71(local_58._21_7_,
                  (char)uVar9 +
                  ((byte)(SUB164(auVar4 * ZEXT816(0xcccccccccccccccd),8) >> 2) & 0xfe) * -5) &
         0xffffffffffff00ff | 0x30;
    iVar7 = 0x14;
    if (9 < uVar9) {
      lVar11 = 0x13;
      do {
        uVar10 = uVar9 / 10;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar10;
        *(byte *)((long)&local_58.db + lVar11) =
             (char)uVar10 + SUB161(auVar5 * ZEXT816(0x199999999999999a),8) * -10 | 0x30;
        lVar11 = lVar11 + -1;
        bVar3 = 99 < uVar9;
        uVar9 = uVar10;
      } while (bVar3);
      iVar7 = (int)lVar11 + 1;
    }
    if ((long)uVar2 < 0) {
      *(undefined1 *)((long)&uStack_60 + (long)iVar7 + 7) = 0x2d;
      iVar7 = iVar7 + -1;
    }
    uStack_60 = (code *)0x1413e0;
    memcpy(__dest,(void *)((long)&local_58.db + (long)iVar7),0x16 - (long)iVar7);
    uVar8 = 0x15 - iVar7;
  }
  pMem->n = uVar8;
  pMem->enc = '\x01';
  uVar1 = pMem->flags;
  uVar6 = uVar1 & 0xffd3;
  if (bForce == '\0') {
    uVar6 = uVar1;
  }
  pMem->flags = uVar6 | 0x202;
  iVar7 = 0;
  if (enc != '\x01') {
    uStack_60 = (code *)0x141440;
    sqlite3VdbeMemTranslate(pMem,enc);
    iVar7 = 0;
  }
LAB_00141440:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  uStack_60 = vdbeMemAddTerminator;
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  const int nByte = 32;

  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(pMem->flags&MEM_Zero) );
  assert( !(pMem->flags&(MEM_Str|MEM_Blob)) );
  assert( pMem->flags&(MEM_Int|MEM_Real|MEM_IntReal) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    pMem->enc = 0;
    return SQLITE_NOMEM_BKPT;
  }

  vdbeMemRenderNum(nByte, pMem->z, pMem);
  assert( pMem->z!=0 );
  assert( pMem->n==(int)sqlite3Strlen30NN(pMem->z) );
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}